

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void inblock(char *s)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ushort **ppuVar7;
  Item *pIVar8;
  long lVar9;
  ulong uVar10;
  char local_b8 [31];
  char cStack_99;
  char word [100];
  
  iVar4 = linenum;
  do {
    pcVar6 = Gets(buf);
    if (pcVar6 == (char *)0x0) {
      linenum = iVar4;
      diag(s," block goes to end of file");
    }
    sprintf(local_b8,"END%s",s);
    pcVar6 = buf;
    while( true ) {
      bVar1 = *pcVar6;
      uVar10 = (ulong)bVar1;
      if ((bVar1 != 0x20) && (bVar1 != 9)) break;
      pcVar6 = (char *)((byte *)pcVar6 + 1);
    }
    ppuVar7 = __ctype_b_loc();
    puVar3 = *ppuVar7;
    uVar2 = puVar3[(char)bVar1];
    if ((uVar2 >> 10 & 1) != 0) {
      lVar9 = 1;
      while ((uVar2 >> 10 & 1) != 0) {
        word[lVar9 + -1] = (char)uVar10;
        uVar10 = (ulong)(char)((byte *)pcVar6)[lVar9];
        lVar9 = lVar9 + 1;
        uVar2 = puVar3[uVar10];
      }
      word[lVar9 + -1] = '\0';
      iVar5 = strcmp(local_b8,word);
      if (iVar5 == 0) {
        return;
      }
    }
    pIVar8 = putintoken(buf,0x143);
    pIVar8->itemtype = 0x102;
  } while( true );
}

Assistant:

void inblock(s)
	char           *s;
{				/* copy input verbatim to intoken up to END*s
				 * error if we get the whole input */
	char            *cp;
	int             l;
	Item		*q;

	l = linenum;
	for (;;) {
		cp = Gets(buf);
		if (cp == (char *) 0) {
			linenum = l;
			diag(s, " block goes to end of file");
		}
		if (isend(s, buf)) {
			break;
		}
		q = putintoken(buf, STRING);
		q->itemtype = VERBATIM;
	}
}